

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightconf_sample.cpp
# Opt level: O0

void usage(void)

{
  std::operator<<((ostream *)&std::cout,
                  "lightconf sample program usage:\n  lightconf_sample [command] [args]\n\nCommands\n--------\nsetmaintainer <name>\n   Set the name of the maintainer of the user config file\nadduser <uid> <firstname> <lastname> <permissions> <mm> <dd> <yyyy>\n   Add a new user to the config file\n     uid         The user\'s unique identification number\n     firstname   The first name of the user\n     lastname    The last name of the user\n     permissions A string optionally containing the letters \'R\', \'C\', \'U\', and \'D\' for\n                 Read, Create, Update, and Delete permissions respectively\n     mm dd yyyy  The date on which the user joined the system\ndeluser <uid>\n   Delete the specified user from the system\nprint\n   Print the current state of the system\n"
                 );
  return;
}

Assistant:

void usage() {
    std::cout <<
        "lightconf sample program usage:\n"
        "  lightconf_sample [command] [args]\n"
        "\n"
        "Commands\n"
        "--------\n"
        "setmaintainer <name>\n"
        "   Set the name of the maintainer of the user config file\n"
        "adduser <uid> <firstname> <lastname> <permissions> <mm> <dd> <yyyy>\n"
        "   Add a new user to the config file\n"
        "     uid         The user's unique identification number\n"
        "     firstname   The first name of the user\n"
        "     lastname    The last name of the user\n"
        "     permissions A string optionally containing the letters 'R', 'C', 'U', and 'D' for\n"
        "                 Read, Create, Update, and Delete permissions respectively\n"
        "     mm dd yyyy  The date on which the user joined the system\n"
        "deluser <uid>\n"
        "   Delete the specified user from the system\n"
        "print\n"
        "   Print the current state of the system\n";
}